

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O2

ArrowSchemaMetadata *
duckdb::ArrowSchemaMetadata::NonCanonicalType
          (ArrowSchemaMetadata *__return_storage_ptr__,string *type_name,string *vendor_name)

{
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *this;
  pointer pCVar1;
  type this_00;
  ComplexJSON *complex_json;
  allocator local_7a;
  allocator local_79;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> local_78;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> local_70;
  string local_68;
  string local_48;
  
  ArrowSchemaMetadata(__return_storage_ptr__);
  ::std::__cxx11::string::string((string *)&local_68,"ARROW:extension:name",&local_7a);
  ::std::__cxx11::string::string((string *)&local_48,"arrow.opaque",&local_79);
  AddOption(__return_storage_ptr__,&local_68,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  this = &__return_storage_ptr__->extension_metadata_map;
  pCVar1 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
           operator->(this);
  ::std::__cxx11::string::string((string *)&local_68,"vendor_name",(allocator *)&local_48);
  make_uniq<duckdb::ComplexJSON,std::__cxx11::string_const&>((duckdb *)&local_70,vendor_name);
  ComplexJSON::AddObject(pCVar1,&local_68,&local_70);
  std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)&local_70
            );
  ::std::__cxx11::string::~string((string *)&local_68);
  pCVar1 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
           operator->(this);
  ::std::__cxx11::string::string((string *)&local_68,"type_name",(allocator *)&local_48);
  make_uniq<duckdb::ComplexJSON,std::__cxx11::string_const&>((duckdb *)&local_78,type_name);
  ComplexJSON::AddObject(pCVar1,&local_68,&local_78);
  std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)&local_78
            );
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::string((string *)&local_68,"ARROW:extension:metadata",&local_7a);
  this_00 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
            operator*(this);
  StringUtil::ToComplexJSONMap_abi_cxx11_(&local_48,(StringUtil *)this_00,complex_json);
  AddOption(__return_storage_ptr__,&local_68,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

ArrowSchemaMetadata ArrowSchemaMetadata::NonCanonicalType(const string &type_name, const string &vendor_name) {
	ArrowSchemaMetadata metadata;
	metadata.AddOption(ARROW_EXTENSION_NAME, ArrowExtensionMetadata::ARROW_EXTENSION_NON_CANONICAL);
	// We have to set the metadata key with type_name and vendor_name.
	metadata.extension_metadata_map->AddObject("vendor_name", make_uniq<ComplexJSON>(vendor_name));
	metadata.extension_metadata_map->AddObject("type_name", make_uniq<ComplexJSON>(type_name));
	metadata.AddOption(ARROW_METADATA_KEY, StringUtil::ToComplexJSONMap(*metadata.extension_metadata_map));
	return metadata;
}